

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool __thiscall
google::anon_unknown_1::CommandLineFlag::Validate(CommandLineFlag *this,FlagValue *value)

{
  ValidateFnProto UNRECOVERED_JUMPTABLE;
  char *pcVar1;
  bool bVar2;
  
  UNRECOVERED_JUMPTABLE = this->validate_fn_proto_;
  if (UNRECOVERED_JUMPTABLE == (ValidateFnProto)0x0) {
    return true;
  }
  if ((byte)value->type_ < 7) {
    pcVar1 = this->name_;
    switch(value->type_) {
    case '\0':
      bVar2 = (*UNRECOVERED_JUMPTABLE)(pcVar1,(ulong)*value->value_buffer_);
      return bVar2;
    default:
      bVar2 = (*UNRECOVERED_JUMPTABLE)(pcVar1,(ulong)*value->value_buffer_);
      return bVar2;
    case '\x03':
    case '\x04':
      bVar2 = (*UNRECOVERED_JUMPTABLE)(pcVar1,*value->value_buffer_);
      return bVar2;
    case '\x05':
      bVar2 = (*UNRECOVERED_JUMPTABLE)(*value->value_buffer_,pcVar1);
      return bVar2;
    case '\x06':
      bVar2 = (*UNRECOVERED_JUMPTABLE)(pcVar1,value->value_buffer_);
      return bVar2;
    }
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                ,0x193,
                "bool google::(anonymous namespace)::FlagValue::Validate(const char *, ValidateFnProto) const"
               );
}

Assistant:

ValidateFnProto validate_function() const { return validate_fn_proto_; }